

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseUnaryOp.h
# Opt level: O2

void Eigen::internal::
     assign_LinearTraversal_CompleteUnrolling<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_1,_3>
     ::run(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *dst,
          Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *src)

{
  Nested pMVar1;
  PointerType pdVar2;
  
  pMVar1 = (src->m_matrix).m_xpr;
  pdVar2 = (dst->super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  pdVar2[3] = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] * (src->m_matrix).m_functor.m_other;
  pdVar2[6] = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * (src->m_matrix).m_functor.m_other;
  return;
}

Assistant:

const typename internal::remove_all<typename XprType::Nested>::type&
    nestedExpression() const { return m_xpr; }